

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDMR::processSyncOrSkip(DSDDMR *this)

{
  bool bVar1;
  long *in_RDI;
  DSDSync syncEngine;
  SyncPattern patterns [2];
  int sync_db_size;
  DSDSymbol *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  SyncPattern *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  uchar *in_stack_ffffffffffffffa8;
  DSDSync *in_stack_ffffffffffffffb0;
  
  if (0x18 < (int)in_RDI[1]) {
    DSDSymbol::getSyncDibitBack(in_stack_ffffffffffffff80,(uint)((ulong)in_RDI >> 0x20));
    DSDSync::matchSome(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4
                       ,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    bVar1 = DSDSync::isMatching((DSDSync *)&stack0xffffffffffffff80,SyncDMRDataBS);
    if (bVar1) {
      processDataFirstHalf
                ((DSDDMR *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      *(undefined4 *)(*in_RDI + 0xed00) = 8;
      return;
    }
    bVar1 = DSDSync::isMatching((DSDSync *)&stack0xffffffffffffff80,SyncDMRVoiceBS);
    if (bVar1) {
      processVoiceFirstHalf
                ((DSDDMR *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      *(undefined4 *)(*in_RDI + 0xed00) = 7;
      return;
    }
  }
  if ((int)in_RDI[1] == 0x8f) {
    *(int *)((long)in_RDI + 0x14) = (*(int *)((long)in_RDI + 0x14) + 1) % 2;
    *(undefined1 *)(in_RDI + 3) = 1;
    *(undefined4 *)(*in_RDI + 0xed00) = 7;
    *(undefined4 *)(in_RDI + 1) = 0;
  }
  else {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
  }
  *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + 1;
  return;
}

Assistant:

void DSDDMR::processSyncOrSkip()
{
    const int sync_db_size = IN_DIBITS(DMR_SYNC_LEN);
    const DSDSync::SyncPattern patterns[2] = { DSDSync::SyncDMRDataBS, DSDSync::SyncDMRVoiceBS };

    if (m_symbolIndex > sync_db_size) // accumulate enough symbols to look for a sync
    {
        DSDSync syncEngine;
        syncEngine.matchSome(m_dsdDecoder->m_dsdSymbol.getSyncDibitBack(sync_db_size), sync_db_size, patterns, 2);

        if (syncEngine.isMatching(DSDSync::SyncDMRDataBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: data sync" << std::endl;
            processDataFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRdata;
            return;
        }
        else if (syncEngine.isMatching(DSDSync::SyncDMRVoiceBS))
        {
//		    std::cerr << "DSDDMR::processSyncOrSkip: voice sync" << std::endl;
            processVoiceFirstHalf(90);
            m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
            return;
        }
    }

    if (m_symbolIndex == IN_DIBITS(DMR_TS_LEN) - 1) // last dibit
    {
        // return to voice super frame
        m_slot = (DSDDMRSlot) (((int) m_slot + 1) % 2); // to keep the slot in the next slot period fake a slot reversal
        m_continuation = true;
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDMRvoice;
        m_symbolIndex = 0;
    }
    else
    {
        m_symbolIndex++;
    }

    m_cachSymbolIndex++; // last dibit counts
}